

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::CollationIterator::nextSkippedCodePoint(CollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  UChar32 c;
  UErrorCode *errorCode_local;
  CollationIterator *this_local;
  
  if ((this->skipped == (SkippedState *)0x0) ||
     (UVar1 = SkippedState::hasNext(this->skipped), UVar1 == '\0')) {
    if (this->numCpFwd == 0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
      if (((this->skipped != (SkippedState *)0x0) &&
          (UVar1 = SkippedState::isEmpty(this->skipped), UVar1 == '\0')) && (-1 < this_local._4_4_))
      {
        SkippedState::incBeyond(this->skipped);
      }
      if ((0 < this->numCpFwd) && (-1 < this_local._4_4_)) {
        this->numCpFwd = this->numCpFwd + -1;
      }
    }
  }
  else {
    this_local._4_4_ = SkippedState::next(this->skipped);
  }
  return this_local._4_4_;
}

Assistant:

UChar32
CollationIterator::nextSkippedCodePoint(UErrorCode &errorCode) {
    if(skipped != NULL && skipped->hasNext()) { return skipped->next(); }
    if(numCpFwd == 0) { return U_SENTINEL; }
    UChar32 c = nextCodePoint(errorCode);
    if(skipped != NULL && !skipped->isEmpty() && c >= 0) { skipped->incBeyond(); }
    if(numCpFwd > 0 && c >= 0) { --numCpFwd; }
    return c;
}